

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

Result<void> * __thiscall
wallet::CWallet::RemoveTxs
          (Result<void> *__return_storage_ptr__,CWallet *this,
          vector<uint256,_std::allocator<uint256>_> *txs_to_remove)

{
  base_blob<256u> *pbVar1;
  __node_type *p_Var2;
  long *plVar3;
  long lVar4;
  pointer p_Var5;
  bool bVar6;
  WalletDatabase *pWVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  CTxIn *txin;
  long lVar8;
  bilingual_str *this_00;
  base_blob<256u> *this_01;
  _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *it;
  pointer p_Var9;
  long in_FS_OFFSET;
  iterator it_wtx;
  vector<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
  erased_txs;
  WalletBatch local_208;
  bilingual_str local_1f8;
  bilingual_str local_1b8;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined1 local_158 [32];
  bilingual_str local_138;
  uint256 hash;
  bilingual_str str_err;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar7 = GetDatabase(this);
  (*pWVar7->_vptr_WalletDatabase[0xe])(&local_208,pWVar7,1);
  local_208.m_database = pWVar7;
  bVar6 = WalletBatch::TxnBegin(&local_208);
  if (!bVar6) {
    _(&local_78,(ConstevalStringLiteral)0xe1be24);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_78);
    bilingual_str::~bilingual_str(&local_78);
    goto LAB_009a7e75;
  }
  erased_txs.
  super__Vector_base<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  str_err.original._M_dataplus._M_p = (pointer)&str_err.original.field_2;
  str_err.original._M_string_length = 0;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  str_err.original.field_2._M_local_buf[0] = '\0';
  str_err.translated._M_dataplus._M_p = (pointer)&str_err.translated.field_2;
  str_err.translated._M_string_length = 0;
  erased_txs.
  super__Vector_base<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  erased_txs.
  super__Vector_base<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  str_err.translated.field_2._M_local_buf[0] = '\0';
  pbVar1 = (base_blob<256u> *)
           (txs_to_remove->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_01 = (base_blob<256u> *)
                 (txs_to_remove->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
                 super__Vector_impl_data._M_start; this_01 != pbVar1; this_01 = this_01 + 0x20) {
    it_wtx.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur =
         (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>)
         std::
         _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         ::find(&(this->mapWallet)._M_h,(key_type *)this_01);
    if (it_wtx.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur
        == (__node_type *)0x0) {
      _((bilingual_str *)(local_158 + 0x20),(ConstevalStringLiteral)0xe1be5a);
      base_blob<256u>::GetHex_abi_cxx11_((string *)local_158,this_01);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)&hash,(tinyformat *)(local_158 + 0x20),(bilingual_str *)local_158,
                 args);
LAB_009a7cea:
      bilingual_str::operator=(&str_err,(bilingual_str *)&hash);
      bilingual_str::~bilingual_str((bilingual_str *)&hash);
      std::__cxx11::string::~string((string *)local_158);
      bilingual_str::~bilingual_str((bilingual_str *)(local_158 + 0x20));
      break;
    }
    local_178 = *(undefined8 *)this_01;
    uStack_170 = *(undefined8 *)(this_01 + 8);
    local_168 = *(undefined8 *)(this_01 + 0x10);
    uStack_160 = *(undefined8 *)(this_01 + 0x18);
    bVar6 = WalletBatch::EraseTx(&local_208,(base_blob<256U>)*(base_blob<256U> *)this_01);
    if (!bVar6) {
      _((bilingual_str *)(local_158 + 0x20),(ConstevalStringLiteral)0xe1be88);
      base_blob<256u>::GetHex_abi_cxx11_((string *)local_158,this_01);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)&hash,(tinyformat *)(local_158 + 0x20),(bilingual_str *)local_158,
                 args);
      goto LAB_009a7cea;
    }
    std::
    vector<std::__detail::_Node_const_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>,std::allocator<std::__detail::_Node_const_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>>>
    ::
    emplace_back<std::__detail::_Node_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>&>
              ((vector<std::__detail::_Node_const_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>,std::allocator<std::__detail::_Node_const_iterator<std::pair<uint256_const,wallet::CWalletTx>,false,true>>>
                *)&erased_txs,&it_wtx);
  }
  if (str_err.original._M_string_length == 0) {
    bVar6 = WalletBatch::TxnCommit(&local_208);
    p_Var5 = erased_txs.
             super__Vector_base<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (!bVar6) {
      _(&local_1f8,(ConstevalStringLiteral)0xe1bea9);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                 &local_1f8);
      this_00 = &local_1f8;
      goto LAB_009a7e59;
    }
    for (p_Var9 = erased_txs.
                  super__Vector_base<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; p_Var9 != p_Var5; p_Var9 = p_Var9 + 1)
    {
      p_Var2 = (p_Var9->super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
               )._M_cur;
      hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           (p_Var2->super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
           super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>._M_storage.
           _M_storage.__align;
      hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)
            ((long)&(p_Var2->
                    super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                    super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                    _M_storage._M_storage + 8);
      hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)
            ((long)&(p_Var2->
                    super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                    super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                    _M_storage._M_storage + 0x10);
      hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)
            ((long)&(p_Var2->
                    super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>).
                    super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>.
                    _M_storage._M_storage + 0x18);
      std::
      _Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
      ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,wallet::CWalletTx*>,std::_Select1st<std::pair<long_const,wallet::CWalletTx*>>,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
                          *)&this->wtxOrdered,
                         *(_Base_ptr *)
                          ((long)&(p_Var2->
                                  super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                  ._M_storage._M_storage + 0x80));
      plVar3 = *(long **)((long)&(((p_Var9->
                                   super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                   )._M_cur)->
                                 super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                 ).
                                 super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                 ._M_storage._M_storage + 0x1b8);
      lVar4 = plVar3[1];
      for (lVar8 = *plVar3; lVar8 != lVar4; lVar8 = lVar8 + 0x68) {
        std::
        _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
        ::_M_erase(&(this->mapTxSpends)._M_h,lVar8);
      }
      std::
      _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::erase(&(this->mapWallet)._M_h,
              (const_iterator)
              (p_Var9->super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>)
              ._M_cur);
      boost::signals2::
      signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
      ::operator()(&this->NotifyTransactionChanged,&hash,CT_DELETED);
    }
    MarkDirty(this);
    (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index = '\x01';
  }
  else {
    WalletBatch::TxnAbort(&local_208);
    bilingual_str::bilingual_str(&local_1b8,&str_err);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_1b8);
    this_00 = &local_1b8;
LAB_009a7e59:
    bilingual_str::~bilingual_str(this_00);
  }
  bilingual_str::~bilingual_str(&str_err);
  std::
  _Vector_base<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
  ::~_Vector_base(&erased_txs.
                   super__Vector_base<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>,_std::allocator<std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>_>_>
                 );
LAB_009a7e75:
  if ((tuple<wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
      local_208.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
    (*(*(_func_int ***)
        local_208.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> CWallet::RemoveTxs(std::vector<uint256>& txs_to_remove)
{
    AssertLockHeld(cs_wallet);
    WalletBatch batch(GetDatabase());
    if (!batch.TxnBegin()) return util::Error{_("Error starting db txn for wallet transactions removal")};

    // Check for transaction existence and remove entries from disk
    using TxIterator = std::unordered_map<uint256, CWalletTx, SaltedTxidHasher>::const_iterator;
    std::vector<TxIterator> erased_txs;
    bilingual_str str_err;
    for (const uint256& hash : txs_to_remove) {
        auto it_wtx = mapWallet.find(hash);
        if (it_wtx == mapWallet.end()) {
            str_err = strprintf(_("Transaction %s does not belong to this wallet"), hash.GetHex());
            break;
        }
        if (!batch.EraseTx(hash)) {
            str_err = strprintf(_("Failure removing transaction: %s"), hash.GetHex());
            break;
        }
        erased_txs.emplace_back(it_wtx);
    }

    // Roll back removals in case of an error
    if (!str_err.empty()) {
        batch.TxnAbort();
        return util::Error{str_err};
    }

    // Dump changes to disk
    if (!batch.TxnCommit()) return util::Error{_("Error committing db txn for wallet transactions removal")};

    // Update the in-memory state and notify upper layers about the removals
    for (const auto& it : erased_txs) {
        const uint256 hash{it->first};
        wtxOrdered.erase(it->second.m_it_wtxOrdered);
        for (const auto& txin : it->second.tx->vin)
            mapTxSpends.erase(txin.prevout);
        mapWallet.erase(it);
        NotifyTransactionChanged(hash, CT_DELETED);
    }

    MarkDirty();

    return {}; // all good
}